

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O2

void __thiscall binlog::EventStream::readClockSync(EventStream *this,Range range)

{
  ClockSync clockSync;
  undefined1 auStack_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  Range local_20;
  
  local_20._end = range._end;
  local_20._begin = range._begin;
  local_48._M_p = (pointer)&local_38;
  auStack_68._16_4_ = 0;
  auStack_68._20_8_ = 0;
  auStack_68._0_8_ = 0;
  auStack_68._8_4_ = 0;
  auStack_68._12_4_ = 0;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  mserialize::
  StructDeserializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
  ::deserialize<binlog::Range>((ClockSync *)auStack_68,&local_20);
  ClockSync::operator=(&this->_clockSync,(ClockSync *)auStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void EventStream::readClockSync(Range range)
{
  // Make sure _clockSync is updated only if deserialize does not throw
  ClockSync clockSync;
  mserialize::deserialize(clockSync, range);
  _clockSync = std::move(clockSync);
}